

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O0

Value __thiscall GuiScope::getValue(GuiScope *this,string *name,int comps)

{
  Value VVar1;
  int iVar2;
  bool bVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  int local_54;
  undefined4 uStack_50;
  undefined8 local_4c;
  float local_44;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
  local_38;
  iterator it;
  int comps_local;
  string *name_local;
  GuiScope *this_local;
  undefined8 local_10;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
  ._M_cur._4_4_ = comps;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>_>
       ::find(&this->vars_,name);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>_>
       ::end(&this->vars_);
  bVar3 = std::__detail::operator!=(&local_38,&local_40);
  iVar2 = it.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
          ._M_cur._4_4_;
  if (bVar3) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_false,_true>
                           *)&local_38);
    (ppVar4->second).components = iVar2;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_false,_true>
                           *)&local_38);
    this_local = *(GuiScope **)&(ppVar4->second).value;
    local_10._0_4_ = (ppVar4->second).value.z;
    local_10._4_4_ = (ppVar4->second).value.w;
  }
  else {
    memset(&local_54,0,0x14);
    local_54 = it.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
               ._M_cur._4_4_;
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>_>
             ::operator[](&this->vars_,name);
    pmVar5->components = local_54;
    (pmVar5->value).x = (float)uStack_50;
    (pmVar5->value).y = (float)(undefined4)local_4c;
    (pmVar5->value).z = (float)local_4c._4_4_;
    (pmVar5->value).w = local_44;
    this_local = *(GuiScope **)&pmVar5->value;
    local_10._0_4_ = (pmVar5->value).z;
    local_10._4_4_ = (pmVar5->value).w;
  }
  VVar1.z = (float)(undefined4)local_10;
  VVar1.w = (float)local_10._4_4_;
  VVar1._0_8_ = this_local;
  return VVar1;
}

Assistant:

Value GuiScope::getValue(const std::string& name, int comps) {
	auto it = vars_.find(name);
	if (it != vars_.end()) {
		it->second.components = comps;
		return it->second.value;
	}

	return (vars_[name] = Variable{comps, Value{0}}).value;
}